

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_28::IsBasicBlockSafeToClone(IRContext *context,BasicBlock *bb)

{
  Instruction *this;
  bool bVar1;
  Instruction *pIVar2;
  Instruction *inst;
  
  this = &(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar2 = &(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  do {
    this = *(Instruction **)((long)&this->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8);
    if (this == pIVar2) break;
    bVar1 = Instruction::IsBranch(this);
  } while ((bVar1) || (bVar1 = IRContext::IsCombinatorInstruction(context,this), bVar1));
  return this == pIVar2;
}

Assistant:

inline bool IsBasicBlockSafeToClone(IRContext* context, BasicBlock* bb) {
  for (Instruction& inst : *bb) {
    if (!inst.IsBranch() && !context->IsCombinatorInstruction(&inst))
      return false;
  }

  return true;
}